

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::clearFocus(QWidget *this)

{
  QObject *pQVar1;
  bool bVar2;
  QWidget *pQVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  code *local_48;
  undefined1 *puStack_40;
  QWidget *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = hasFocus(this);
  if (bVar2) {
    if ((this->data->widget_attributes & 0x4000) != 0) {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    local_38 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFocusEvent::QFocusEvent((QFocusEvent *)&local_48,FocusAboutToChange,OtherFocusReason);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
    QFocusEvent::~QFocusEvent((QFocusEvent *)&local_48);
  }
  pQVar3 = window(this);
  lVar6 = *(long *)(*(long *)&pQVar3->field_0x8 + 0x78);
  pQVar3 = this;
  if ((lVar6 == 0) || (lVar6 = *(long *)(lVar6 + 8), lVar6 == 0)) {
    lVar6 = 0;
  }
  else if (*(long **)(lVar6 + 0x20) != (long *)0x0) {
    lVar4 = (**(code **)(**(long **)(lVar6 + 0x20) + 0x80))();
    if (lVar4 == 0) {
      lVar4 = *(long *)(*(long *)&this->field_0x8 + 0x90);
    }
    goto LAB_002f19a7;
  }
  lVar4 = 0;
LAB_002f19a7:
  while (pQVar3 != (QWidget *)0x0) {
    lVar5 = *(long *)&pQVar3->field_0x8;
    if (*(QWidget **)(lVar5 + 0x90) == this) {
      *(undefined8 *)(lVar5 + 0x90) = 0;
    }
    pQVar3 = *(QWidget **)(lVar5 + 0x10);
  }
  if ((lVar4 != 0) && (lVar5 = (**(code **)(**(long **)(lVar6 + 0x20) + 0x80))(), lVar4 != lVar5)) {
    pQVar1 = *(QObject **)(lVar6 + 0x20);
    (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1);
    QWindow::focusObjectChanged(pQVar1);
  }
  lVar6 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if ((lVar6 != 0) && (lVar6 = *(long *)(lVar6 + 0x10), lVar6 != 0)) {
    QGraphicsItem::clearFocus((QGraphicsItem *)(lVar6 + 0x10));
  }
  bVar2 = hasFocus(this);
  if (bVar2) {
    QApplicationPrivate::setFocusWidget((QWidget *)0x0,OtherFocusReason);
    local_48 = QFont::strikeOut;
    puStack_40 = (undefined1 *)0xaaaaaaaa00008005;
    local_30 = 0xaaaaaaaaffffffff;
    local_38 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::clearFocus()
{
    if (hasFocus()) {
        if (testAttribute(Qt::WA_InputMethodEnabled))
            QGuiApplication::inputMethod()->commit();

        QFocusEvent focusAboutToChange(QEvent::FocusAboutToChange);
        QCoreApplication::sendEvent(this, &focusAboutToChange);
    }

    QTLWExtra *extra = window()->d_func()->maybeTopData();
    QObject *originalFocusObject = nullptr;
    if (extra && extra->window) {
        originalFocusObject = extra->window->focusObject();
        // the window's focus object might already be nullptr if we are in the destructor, but we still
        // need to update QGuiApplication and input context if we have a focus widget.
        if (!originalFocusObject)
            originalFocusObject = focusWidget();
    }

    QWidget *w = this;
    while (w) {
        // Just like setFocus(), we update (clear) the focus_child of our parents
        if (w->d_func()->focus_child == this)
            w->d_func()->focus_child = nullptr;
        w = w->parentWidget();
    }

    // We've potentially cleared the focus_child of our parents, so we need
    // to report this to the rest of Qt. Note that the focus_child is not the same
    // thing as the application's focusWidget, which is why this piece of code is
    // not inside a hasFocus() block.
    if (originalFocusObject && originalFocusObject != extra->window->focusObject())
        emit extra->window->focusObjectChanged(extra->window->focusObject());

#if QT_CONFIG(graphicsview)
    const auto &topData = d_func()->extra;
    if (topData && topData->proxyWidget)
        topData->proxyWidget->clearFocus();
#endif

    if (hasFocus()) {
        // Update proxy state
        QApplicationPrivate::setFocusWidget(nullptr, Qt::OtherFocusReason);
#if QT_CONFIG(accessibility)
        QAccessibleEvent event(this, QAccessible::Focus);
        QAccessible::updateAccessibility(&event);
#endif
    }
}